

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::fx_comp::~fx_comp(fx_comp *this)

{
  fx_comp *this_local;
  
  ~fx_comp(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      TEST_EQ("#f", run("(fx=? 12 13)"));
      TEST_EQ("#f", run("(fx=? 13 12)"));
      TEST_EQ("#t", run("(fx=? 12 12)"));

      TEST_EQ("#t", run("(fx<? 12 13)"));
      TEST_EQ("#f", run("(fx<? 13 12)"));
      TEST_EQ("#f", run("(fx<? 12 12)"));

      TEST_EQ("#f", run("(fx>? 12 13)"));
      TEST_EQ("#t", run("(fx>? 13 12)"));
      TEST_EQ("#f", run("(fx>? 12 12)"));

      TEST_EQ("#t", run("(fx<=? 12 13)"));
      TEST_EQ("#f", run("(fx<=? 13 12)"));
      TEST_EQ("#t", run("(fx<=? 12 12)"));

      TEST_EQ("#f", run("(fx>=? 12 13)"));
      TEST_EQ("#t", run("(fx>=? 13 12)"));
      TEST_EQ("#t", run("(fx>=? 12 12)"));

      TEST_EQ("25", run("(fx+ 12 13)"));
      TEST_EQ("25", run("(fx+ 13 12)"));
      TEST_EQ("24", run("(fx+ 12 12)"));
      TEST_EQ("-1", run("(fx- 12 13)"));
      TEST_EQ("1", run("(fx- 13 12)"));
      TEST_EQ("0", run("(fx- 12 12)"));
      TEST_EQ("156", run("(fx* 12 13)"));
      TEST_EQ("156", run("(fx* 13 12)"));
      TEST_EQ("144", run("(fx* 12 12)"));
      TEST_EQ("-156", run("(fx* 12 -13)"));
      TEST_EQ("-156", run("(fx* -13 12)"));
      TEST_EQ("-144", run("(fx* 12 -12)"));
      TEST_EQ("6", run("(fx/ 12 2)"));
      TEST_EQ("1", run("(fx/ 13 12)"));
      TEST_EQ("2", run("(fx/ 12 5)"));
      TEST_EQ("-6", run("(fx/ -12 2)"));
      TEST_EQ("-1", run("(fx/ 13 -12)"));
      TEST_EQ("-2", run("(fx/ -12 5)"));
      }